

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O0

int hwpq_vdpp_init(rk_vdpp_context *p_ctx_ptr)

{
  MPP_RET MVar1;
  uint local_3c;
  MppBuffer pvStack_38;
  MPP_RET ret;
  MppBuffer histbuf;
  MppBufferGroup memGroup;
  vdpp_com_ctx *vdpp;
  VdppCtxImpl *p;
  rk_vdpp_context *p_ctx_ptr_local;
  
  vdpp = (vdpp_com_ctx *)0x0;
  memGroup = (MppBufferGroup)0x0;
  histbuf = (MppBuffer)0x0;
  pvStack_38 = (MppBuffer)0x0;
  p = (VdppCtxImpl *)p_ctx_ptr;
  if ((hwpq_vdpp_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), enter",(char *)0x0,0x279,"hwpq_vdpp_init");
  }
  if (p == (VdppCtxImpl *)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL vdpp ctx pointer\n",(char *)0x0);
    local_3c = 0xfffffffd;
  }
  else {
    vdpp = (vdpp_com_ctx *)mpp_osal_malloc("hwpq_vdpp_init",0x18);
    if (vdpp == (vdpp_com_ctx *)0x0) {
      _mpp_log_l(2,(char *)0x0,"alloc vdpp ctx failed!",(char *)0x0);
      local_3c = 0xfffffffc;
    }
    else {
      memGroup = rockchip_vdpp_api_alloc_ctx();
      if (((vdpp_com_ctx *)memGroup == (vdpp_com_ctx *)0x0) ||
         (((vdpp_com_ctx *)memGroup)->ops == (vdpp_com_ops *)0x0)) {
        _mpp_log_l(2,(char *)0x0,"alloc vdpp ctx failed!",(char *)0x0);
        local_3c = 0xfffffffc;
      }
      else {
        MVar1 = mpp_buffer_group_get
                          (&histbuf,MPP_BUFFER_TYPE_DRM,MPP_BUFFER_INTERNAL,(char *)0x0,
                           "hwpq_vdpp_init");
        if (MVar1 == MPP_OK) {
          mpp_buffer_get_with_tag
                    (histbuf,&stack0xffffffffffffffc8,0x2800,(char *)0x0,"hwpq_vdpp_init");
          mpp_env_get_u32("vendor.vdpp.debug_cfg",&hwpq_vdpp_debug,0);
          local_3c = 0;
          if ((**memGroup == 0) ||
             (local_3c = (*(code *)**memGroup)((long)memGroup + 8), local_3c == 0)) {
            vdpp->ops = (vdpp_com_ops *)memGroup;
            vdpp->priv = histbuf;
            *(MppBuffer *)&vdpp->ver = pvStack_38;
            p->vdpp = vdpp;
            if ((hwpq_vdpp_debug & 1) != 0) {
              _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), leave",(char *)0x0,0x2ad,
                         "hwpq_vdpp_init");
            }
            return local_3c;
          }
          _mpp_log_l(2,(char *)0x0,"vdpp init failed! ret %d\n","hwpq_vdpp_init",(ulong)local_3c);
        }
        else {
          _mpp_log_l(2,(char *)0x0,"memGroup mpp_buffer_group_get failed\n",(char *)0x0);
          local_3c = 0xffffffff;
        }
      }
    }
  }
  if (pvStack_38 != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(pvStack_38,"hwpq_vdpp_init");
    pvStack_38 = (MppBuffer)0x0;
  }
  if (histbuf != (MppBuffer)0x0) {
    mpp_buffer_group_put(histbuf);
    histbuf = (MppBuffer)0x0;
  }
  rockchip_vdpp_api_release_ctx((vdpp_com_ctx *)memGroup);
  if (vdpp != (vdpp_com_ctx *)0x0) {
    mpp_osal_free("hwpq_vdpp_init",vdpp);
  }
  return local_3c;
}

Assistant:

int hwpq_vdpp_init(rk_vdpp_context *p_ctx_ptr)
{
    VdppCtxImpl *p = NULL;
    vdpp_com_ctx *vdpp = NULL;
    MppBufferGroup memGroup = NULL;
    MppBuffer histbuf = NULL;
    MPP_RET ret = MPP_NOK;

    hwpq_vdpp_enter();

    if (NULL == p_ctx_ptr) {
        mpp_err("found NULL vdpp ctx pointer\n");
        ret = MPP_ERR_NULL_PTR;
        goto __ERR;
    }
    /* alloc vdpp ctx impl */
    p = mpp_malloc(VdppCtxImpl, 1);
    if (NULL == p) {
        mpp_err("alloc vdpp ctx failed!");
        ret = MPP_ERR_MALLOC;
        goto __ERR;
    }
    /* alloc vdpp */
    vdpp = rockchip_vdpp_api_alloc_ctx();
    if (NULL == vdpp || NULL == vdpp->ops) {
        mpp_err("alloc vdpp ctx failed!");
        ret = MPP_ERR_MALLOC;
        goto __ERR;
    }
    /* alloc buffer group */
    ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        ret = MPP_NOK;
        goto __ERR;
    }

    mpp_buffer_get(memGroup, &histbuf, VDPP_HIST_LENGTH);
    if (ret) {
        mpp_err("alloc histbuf failed\n");
        ret = MPP_NOK;
        goto __ERR;
    }

    /* setup env prop */
    mpp_env_get_u32(HWPQ_VDPP_DEBUG_CFG_PROP, &hwpq_vdpp_debug, 0);

    if (vdpp->ops->init) {
        ret = vdpp->ops->init(&vdpp->priv);
        if (ret) {
            mpp_err_f("vdpp init failed! ret %d\n", ret);
            goto __ERR;
        }
    }

    p->vdpp = vdpp;
    p->memGroup = memGroup;
    p->histbuf = histbuf;
    *p_ctx_ptr = (rk_vdpp_context)p;

    hwpq_vdpp_leave();
    return ret;

__ERR:
    if (histbuf) {
        mpp_buffer_put(histbuf);
        histbuf = NULL;
    }

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    rockchip_vdpp_api_release_ctx(vdpp);
    MPP_FREE(p);

    return ret;
}